

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Individual.cpp
# Opt level: O2

int __thiscall Individual::valueFunction(Individual *this,shared_ptr<Instance> *myInstance)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int n;
  int *piVar5;
  vector<int,_std::allocator<int>_> Cores;
  allocator_type local_4d;
  value_type_conflict1 local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_4c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,
             (long)((myInstance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   numProcessors,&local_4c,&local_4d);
  piVar2 = (this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar4 = 0;
  n = 0;
  for (piVar5 = (this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar5 != piVar2; piVar5 = piVar5 + 1) {
    iVar1 = *piVar5;
    iVar3 = Instance::getNthTaskLength
                      ((myInstance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                       ,n);
    iVar3 = iVar3 + local_48._M_impl.super__Vector_impl_data._M_start[iVar1];
    local_48._M_impl.super__Vector_impl_data._M_start[iVar1] = iVar3;
    if (iVar4 <= iVar3) {
      iVar4 = iVar3;
    }
    n = n + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return iVar4;
}

Assistant:

int Individual::valueFunction(std::shared_ptr<Instance> myInstance){
	vector<int> Cores(myInstance->getNumProcessors(),0);
	int i = 0;
	int maxSoFar = 0;
	for(auto task : coresAsignedToTasks){
		Cores[task] += myInstance->getNthTaskLength(i);
		maxSoFar = max(maxSoFar,Cores[task]);
		i++;
	}
	return maxSoFar;
}